

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

int __thiscall jaegertracing::net::Socket::open(Socket *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  system_error *this_00;
  int *piVar4;
  error_category *__ecat;
  int __domain;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  int handle;
  int type_local;
  int family_local;
  Socket *this_local;
  
  __domain = (int)__file;
  iVar2 = socket(__domain,__oflag,0);
  bVar1 = isHandleInvalid(iVar2);
  if (!bVar1) {
    this->_handle = iVar2;
    this->_family = __domain;
    this->_type = __oflag;
    return (int)this;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"Failed to open socket, family=");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,__domain);
  poVar3 = std::operator<<(poVar3,", type=");
  std::ostream::operator<<((ostream *)poVar3,__oflag);
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  __ecat = (error_category *)std::_V2::system_category();
  std::__cxx11::ostringstream::str();
  std::system_error::system_error(this_00,iVar2,__ecat,&local_1c8);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void open(int family, int type)
    {
        const auto handle = ::socket(family, type, 0);
        if (isHandleInvalid(handle)) {
            std::ostringstream oss;
            oss << "Failed to open socket"
                   ", family="
                << family << ", type=" << type;
            throw std::system_error(errno, std::system_category(), oss.str());
        }
        _handle = handle;
        _family = family;
        _type = type;
    }